

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall Application::onLogout(Application *this,SessionID *sessionID)

{
  ostream *poVar1;
  
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,"Logout - ");
  std::operator<<(poVar1,(string *)&sessionID->m_frozenString);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Application::onLogout(const FIX::SessionID &sessionID) {
  std::cout << std::endl << "Logout - " << sessionID << std::endl;
}